

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,ModuleInstantiationStmt *stmt)

{
  bool bVar1;
  runtime_error *this_00;
  ulong local_88 [2];
  uint64_t mod_signature;
  uint64_t target_hash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Generator *local_20;
  Generator *target;
  ModuleInstantiationStmt *stmt_local;
  HashVisitor *this_local;
  
  target = (Generator *)stmt;
  stmt_local = (ModuleInstantiationStmt *)this;
  local_20 = ModuleInstantiationStmt::target(stmt);
  bVar1 = Context::has_hash(this->context_,local_20);
  if (!bVar1) {
    target_hash._3_1_ = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_60,"Internal error: ",&local_20->name);
    std::operator+(&local_40,&local_60," doesn\'t have a hash");
    std::runtime_error::runtime_error(this_00,(string *)&local_40);
    target_hash._3_1_ = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  mod_signature = Context::get_hash(this->context_,local_20);
  local_88[1] = 0xe3779b97f4a7c169;
  local_88[0] = mod_signature ^ 0xe3779b97f4a7c169;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->stmt_hashes_,local_88);
  return;
}

Assistant:

void visit(ModuleInstantiationStmt* stmt) override {
        // notice that we don't use any mechanism to lock the context's get hash or set hash
        // it is the caller's responsibility to do prepare the calling sequence so that there
        // won't be any race condition.
        // by requiring this, we can have a lock-free implementation ready to scale
        auto const* target = stmt->target();
        if (!context_->has_hash(target)) {
            throw std::runtime_error("Internal error: " + target->name + " doesn't have a hash");
        }
        uint64_t target_hash = context_->get_hash(target);
        constexpr uint64_t mod_signature = shift_const(0x9e3779b97f4a7c16, 4);
        // we have assign stmts already computed the connections
        stmt_hashes_.emplace_back(target_hash ^ mod_signature);
    }